

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

char * mkfuncname(lua_State *L,char *modname)

{
  char *pcVar1;
  char *mark;
  char *funcname;
  char *modname_local;
  lua_State *L_local;
  
  pcVar1 = strchr(modname,0x2d);
  funcname = modname;
  if (pcVar1 != (char *)0x0) {
    funcname = pcVar1 + 1;
  }
  pcVar1 = luaL_gsub(L,funcname,".","_");
  pcVar1 = lua_pushfstring(L,"luaopen_%s",pcVar1);
  lua_remove(L,-2);
  return pcVar1;
}

Assistant:

static const char *mkfuncname (lua_State *L, const char *modname) {
  const char *funcname;
  const char *mark = strchr(modname, *LUA_IGMARK);
  if (mark) modname = mark + 1;
  funcname = luaL_gsub(L, modname, ".", LUA_OFSEP);
  funcname = lua_pushfstring(L, POF"%s", funcname);
  lua_remove(L, -2);  /* remove 'gsub' result */
  return funcname;
}